

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

JSON * chaiscript::json::JSONParser::parse_next
                 (JSON *__return_storage_ptr__,string *str,size_t *offset)

{
  byte __rhs;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  size_type *local_68;
  size_type local_60;
  size_type local_58;
  undefined8 uStack_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  consume_ws(str,offset);
  if (str->_M_string_length <= *offset) {
    std::__throw_out_of_range_fmt
              ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
  }
  __rhs = (str->_M_dataplus)._M_p[*offset];
  if (__rhs < 0x6e) {
    if (__rhs == 0x22) {
      parse_string(__return_storage_ptr__,str,offset);
      return __return_storage_ptr__;
    }
    if (__rhs == 0x5b) {
      parse_array(__return_storage_ptr__,str,offset);
      return __return_storage_ptr__;
    }
    if (__rhs == 0x66) {
LAB_002f7bc4:
      parse_bool(__return_storage_ptr__,str,offset);
      return __return_storage_ptr__;
    }
  }
  else {
    if (__rhs == 0x6e) {
      parse_null(__return_storage_ptr__,str,offset);
      return __return_storage_ptr__;
    }
    if (__rhs == 0x74) goto LAB_002f7bc4;
    if (__rhs == 0x7b) {
      parse_object(__return_storage_ptr__,str,offset);
      return __return_storage_ptr__;
    }
  }
  if (__rhs == 0x2d || (byte)(__rhs - 0x30) < 10) {
    parse_number(__return_storage_ptr__,str,offset);
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_88,"JSON ERROR: Parse: Unexpected starting character \'","");
  std::operator+(&local_48,&local_88,__rhs);
  pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     (&local_48,"\'");
  local_68 = (size_type *)(pbVar1->_M_dataplus)._M_p;
  paVar2 = &pbVar1->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68 == paVar2) {
    local_58 = paVar2->_M_allocated_capacity;
    uStack_50 = *(undefined8 *)((long)&pbVar1->field_2 + 8);
    local_68 = &local_58;
  }
  else {
    local_58 = paVar2->_M_allocated_capacity;
  }
  local_60 = pbVar1->_M_string_length;
  (pbVar1->_M_dataplus)._M_p = (pointer)paVar2;
  pbVar1->_M_string_length = 0;
  (pbVar1->field_2)._M_local_buf[0] = '\0';
  std::runtime_error::runtime_error(this,(string *)&local_68);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static JSON parse_next(const std::string &str, size_t &offset) {
      char value;
      consume_ws(str, offset);
      value = str.at(offset);
      switch (value) {
        case '[':
          return parse_array(str, offset);
        case '{':
          return parse_object(str, offset);
        case '\"':
          return parse_string(str, offset);
        case 't':
        case 'f':
          return parse_bool(str, offset);
        case 'n':
          return parse_null(str, offset);
        default:
          if ((value <= '9' && value >= '0') || value == '-') {
            return parse_number(str, offset);
          }
      }
      throw std::runtime_error(std::string("JSON ERROR: Parse: Unexpected starting character '") + value + "'");
    }